

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O2

charcount_t utf8::ByteIndexIntoCharacterIndex(LPCUTF8 pch,size_t cbIndex,DecodeOptions options)

{
  uint *puVar1;
  charcount_t cVar2;
  DecodeOptions local_3c;
  uint *puStack_38;
  DecodeOptions localOptions;
  LPCUTF8 pchCurrent;
  
  cVar2 = 0;
  local_3c = options;
  puStack_38 = (uint *)pch;
  if (((ulong)pch & 3) == 0) goto LAB_00608363;
  do {
    do {
      puVar1 = puStack_38;
      if ((pch + cbIndex <= puStack_38) ||
         (Decode((LPCUTF8 *)&stack0xffffffffffffffc8,pch + cbIndex,&local_3c,(bool *)0x0),
         puVar1 == puStack_38)) {
        return cVar2;
      }
      cVar2 = cVar2 + 1;
    } while (((ulong)puStack_38 & 3) != 0);
LAB_00608363:
    for (; (puStack_38 < pch + (cbIndex - 4) && ((*puStack_38 & 0x80808080) == 0));
        puStack_38 = puStack_38 + 1) {
      cVar2 = cVar2 + 4;
    }
  } while( true );
}

Assistant:

charcount_t ByteIndexIntoCharacterIndex(__in_ecount(cbIndex) LPCUTF8 pch, size_t cbIndex, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        LPCUTF8 pchCurrent = pch;
        LPCUTF8 pchEnd = pch + cbIndex;
        LPCUTF8 pchEndMinus4 = pch + (cbIndex - 4);
        charcount_t i = 0;

        // Avoid using a reinterpret_cast to start a misaligned read.
        if (!IsAligned(pchCurrent)) goto LSlowPath;

LFastPath:
        // Skip 4 bytes at a time.
        while (pchCurrent < pchEndMinus4)
        {
            uint32 ch4 = *reinterpret_cast<const uint32 *>(pchCurrent);
            if ((ch4 & 0x80808080) == 0)
            {
                pchCurrent += 4;
                i += 4;
            }
            else break;
        }

LSlowPath:
        while (pchCurrent < pchEnd)
        {
            LPCUTF8 s = pchCurrent;
            Decode(pchCurrent, pchEnd, localOptions);
            if (s == pchCurrent) break;
            i++;

            // Try to return to the fast path avoiding misaligned reads.
            if (IsAligned(pchCurrent)) goto LFastPath;
        }

        return i;
    }